

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int CVodeQuadInit(void *cvode_mem,CVQuadRhsFn fQ,N_Vector yQ0)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  undefined8 *puVar5;
  undefined8 *puVar6;
  sunindextype liw1Q;
  sunindextype lrw1Q;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar4 = 0x48e;
    goto LAB_00112f9b;
  }
  N_VSpace(yQ0,&lrw1Q,&liw1Q);
  *(sunindextype *)((long)cvode_mem + 0x708) = lrw1Q;
  *(sunindextype *)((long)cvode_mem + 0x710) = liw1Q;
  lVar2 = N_VClone(yQ0);
  *(long *)((long)cvode_mem + 0x268) = lVar2;
  if (lVar2 != 0) {
    puVar6 = (undefined8 *)((long)cvode_mem + 0x268);
    lVar2 = N_VClone(yQ0);
    *(long *)((long)cvode_mem + 0x278) = lVar2;
    if (lVar2 != 0) {
      lVar2 = N_VClone(yQ0);
      *(long *)((long)cvode_mem + 0x270) = lVar2;
      puVar5 = puVar6;
      puVar1 = (undefined8 *)((long)cvode_mem + 0x278);
      if (lVar2 != 0) {
        lVar2 = N_VClone(yQ0);
        *(long *)((long)cvode_mem + 0x280) = lVar2;
        if (lVar2 != 0) {
          lVar2 = 0;
          while( true ) {
            iVar4 = *(int *)((long)cvode_mem + 0x598);
            if (iVar4 < lVar2) {
              *(int *)((long)cvode_mem + 0x834) = iVar4;
              lVar2 = (long)iVar4 + 5;
              *(long *)((long)cvode_mem + 0x718) =
                   *(long *)((long)cvode_mem + 0x718) + *(long *)((long)cvode_mem + 0x708) * lVar2;
              *(long *)((long)cvode_mem + 0x720) =
                   *(long *)((long)cvode_mem + 0x720) + lVar2 * *(long *)((long)cvode_mem + 0x710);
              N_VScale(0x3ff0000000000000,yQ0,*(undefined8 *)((long)cvode_mem + 0x200));
              *(CVQuadRhsFn *)((long)cvode_mem + 0x60) = fQ;
              *(undefined8 *)((long)cvode_mem + 0x638) = 0;
              *(undefined8 *)((long)cvode_mem + 0x6b0) = 0;
              *(undefined4 *)((long)cvode_mem + 0x5c) = 1;
              *(undefined4 *)((long)cvode_mem + 0x854) = 1;
              return 0;
            }
            lVar3 = N_VClone(yQ0);
            *(long *)((long)cvode_mem + lVar2 * 8 + 0x200) = lVar3;
            if (lVar3 == 0) break;
            lVar2 = lVar2 + 1;
          }
          N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x268));
          N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x278));
          N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x270));
          N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x280));
          for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
            N_VDestroy(*(undefined8 *)((long)cvode_mem + lVar3 * 8 + 0x200));
          }
          goto LAB_00112f79;
        }
        N_VDestroy(*puVar6);
        puVar5 = (undefined8 *)((long)cvode_mem + 0x278);
        puVar1 = (undefined8 *)((long)cvode_mem + 0x270);
      }
      puVar6 = puVar1;
      N_VDestroy(*puVar5);
    }
    N_VDestroy(*puVar6);
  }
LAB_00112f79:
  msgfmt = "A memory request failed.";
  error_code = -0x14;
  iVar4 = 0x49c;
LAB_00112f9b:
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar4,"CVodeQuadInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeQuadInit(void* cvode_mem, CVQuadRhsFn fQ, N_Vector yQ0)
{
  CVodeMem cv_mem;
  sunbooleantype allocOK;
  sunindextype lrw1Q, liw1Q;

  /* Check cvode_mem */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Set space requirements for one N_Vector */
  N_VSpace(yQ0, &lrw1Q, &liw1Q);
  cv_mem->cv_lrw1Q = lrw1Q;
  cv_mem->cv_liw1Q = liw1Q;

  /* Allocate the vectors (using yQ0 as a template) */
  allocOK = cvQuadAllocVectors(cv_mem, yQ0);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Initialize znQ[0] in the history array */
  N_VScale(ONE, yQ0, cv_mem->cv_znQ[0]);

  /* Copy the input parameters into CVODES state */
  cv_mem->cv_fQ = fQ;

  /* Initialize counters */
  cv_mem->cv_nfQe  = 0;
  cv_mem->cv_netfQ = 0;

  /* Quadrature integration turned ON */
  cv_mem->cv_quadr          = SUNTRUE;
  cv_mem->cv_QuadMallocDone = SUNTRUE;

  /* Quadrature initialization was successful */
  return (CV_SUCCESS);
}